

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

int zip_entry_finalize(zip_t *zip,zip_entry_mark_t *entry_mark,size_t n)

{
  ulong uVar1;
  zip_entry_mark_t *pzVar2;
  void *__ptr;
  ulong uVar3;
  void *__ptr_00;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  __ptr = calloc(n,8);
  if (__ptr == (void *)0x0) {
    iVar6 = -0x15;
  }
  else {
    if (n != 0) {
      uVar3 = 0;
      do {
        uVar1 = entry_mark[uVar3].m_local_header_ofs;
        *(ulong *)((long)__ptr + uVar3 * 8) = uVar1;
        uVar7 = uVar3;
        do {
          uVar4 = uVar7;
          if ((long)uVar4 < 1) {
            uVar4 = 0;
            break;
          }
          uVar7 = uVar4 - 1;
        } while (uVar1 <= *(ulong *)((long)__ptr + uVar4 * 8 + -8));
        if (uVar4 != uVar3) {
          uVar7 = uVar3;
          if (uVar4 < uVar3) {
            do {
              *(undefined8 *)((long)__ptr + uVar7 * 8) =
                   *(undefined8 *)((long)__ptr + uVar7 * 8 + -8);
              uVar7 = uVar7 - 1;
            } while ((long)uVar4 < (long)uVar7);
          }
          *(ulong *)((long)__ptr + uVar4 * 8) = uVar1;
          pzVar2 = entry_mark;
          uVar1 = uVar3;
          if (uVar4 != uVar3) {
            for (; uVar1 != 0; uVar1 = uVar1 - 1) {
              if ((long)uVar4 <= pzVar2->file_index) {
                pzVar2->file_index = pzVar2->file_index + 1;
              }
              pzVar2 = pzVar2 + 1;
            }
            entry_mark[uVar4].file_index = uVar3;
          }
        }
        entry_mark[uVar3].file_index = uVar4;
        uVar3 = uVar3 + 1;
      } while (uVar3 != n);
    }
    __ptr_00 = calloc(n,8);
    if (__ptr_00 == (void *)0x0) {
      iVar6 = -0x15;
    }
    else {
      if (n != 1) {
        lVar5 = 0;
        do {
          *(long *)((long)__ptr_00 + lVar5 * 8) =
               *(long *)((long)__ptr + lVar5 * 8 + 8) - *(long *)((long)__ptr + lVar5 * 8);
          lVar5 = lVar5 + 1;
        } while (n - 1 != lVar5);
      }
      *(mz_uint64 *)((long)__ptr_00 + n * 8 + -8) =
           (zip->archive).m_archive_size - *(long *)((long)__ptr + n * 8 + -8);
      if (n != 0) {
        do {
          entry_mark->lf_length = *(size_t *)((long)__ptr_00 + entry_mark->file_index * 8);
          entry_mark = entry_mark + 1;
          n = n - 1;
        } while (n != 0);
      }
      free(__ptr_00);
      iVar6 = 0;
    }
    free(__ptr);
  }
  return iVar6;
}

Assistant:

static int zip_entry_finalize(struct zip_t *zip,
                              struct zip_entry_mark_t *entry_mark,
                              const size_t n) {
  size_t i = 0;
  mz_uint64 *local_header_ofs_array = (mz_uint64 *)calloc(n, sizeof(mz_uint64));
  if (!local_header_ofs_array) {
    return ZIP_EOOMEM;
  }

  for (i = 0; i < n; ++i) {
    local_header_ofs_array[i] = entry_mark[i].m_local_header_ofs;
    ssize_t index = zip_sort(local_header_ofs_array, i);

    if ((size_t)index != i) {
      zip_index_update(entry_mark, i, index);
    }
    entry_mark[i].file_index = index;
  }

  size_t *length = (size_t *)calloc(n, sizeof(size_t));
  if (!length) {
    CLEANUP(local_header_ofs_array);
    return ZIP_EOOMEM;
  }
  for (i = 0; i < n - 1; i++) {
    length[i] =
        (size_t)(local_header_ofs_array[i + 1] - local_header_ofs_array[i]);
  }
  length[n - 1] =
      (size_t)(zip->archive.m_archive_size - local_header_ofs_array[n - 1]);

  for (i = 0; i < n; i++) {
    entry_mark[i].lf_length = length[entry_mark[i].file_index];
  }

  CLEANUP(length);
  CLEANUP(local_header_ofs_array);
  return 0;
}